

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O3

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::computeInPlace
          (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this)

{
  ulong uVar1;
  double *pdVar2;
  XprTypeNested pMVar3;
  undefined1 auVar4 [16];
  double dVar5;
  Scalar SVar6;
  Scalar SVar7;
  PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pPVar8;
  long lVar9;
  XprTypeNested pMVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  PermIndexType k;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Scalar elements [2];
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  Index biggest_col_index;
  ThisEvaluator thisEval;
  RealScalar beta;
  scalar_sum_op<double,_double> local_129;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  ulong local_108;
  undefined1 local_100 [24];
  RealRowVectorType *local_e8;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_d8;
  variable_if_dynamic<long,__1> local_d0;
  variable_if_dynamic<long,__1> local_c8;
  Index local_c0;
  variable_if_dynamic<long,__1> local_b8;
  Index local_a8;
  double local_98;
  HCoeffsType *local_90;
  RowVectorType *local_88;
  RealRowVectorType *local_80;
  long local_78;
  double local_70;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>_>
  local_68;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_50;
  XprTypeNested local_48;
  XprTypeNested local_40;
  undefined8 local_38;
  
  local_88 = &this->m_temp;
  local_80 = &this->m_colNormsUpdated;
  pdVar12 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array + 2;
  lVar9 = 0x14;
  do {
    dVar5 = SQRT(*pdVar12 * *pdVar12 +
                 pdVar12[-1] * pdVar12[-1] +
                 ((plain_array<double,_9,_0,_0> *)(pdVar12 + -2))->array[0] *
                 ((plain_array<double,_9,_0,_0> *)(pdVar12 + -2))->array[0]);
    (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar9 + 3] = dVar5;
    (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar9] = dVar5;
    lVar9 = lVar9 + 1;
    pdVar12 = pdVar12 + 3;
  } while (lVar9 != 0x17);
  local_90 = &this->m_hCoeffs;
  auVar4 = *(undefined1 (*) [16])
            (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            m_storage.m_data.array;
  uVar17 = auVar4._8_4_;
  uVar18 = auVar4._12_4_;
  if (auVar4._8_8_ <= auVar4._0_8_) {
    uVar17 = auVar4._0_4_;
    uVar18 = auVar4._4_4_;
  }
  dVar5 = (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
          m_storage.m_data.array[2];
  uVar15 = SUB84(dVar5,0);
  uVar16 = (int)((ulong)dVar5 >> 0x20);
  if (dVar5 <= (double)CONCAT44(uVar18,uVar17)) {
    uVar15 = uVar17;
    uVar16 = uVar18;
  }
  dVar5 = (double)CONCAT44(uVar16,uVar15) * 2.220446049250313e-16;
  local_98 = (dVar5 * dVar5) / 3.0;
  this->m_nonzero_pivots = 3;
  this->m_maxpivot = 0.0;
  local_110 = 0x15;
  local_118 = 0x18;
  local_120 = 0;
  local_128 = 0;
  pMVar10 = (XprTypeNested)0x0;
  do {
    pdVar12 = (double *)(3 - (long)pMVar10);
    local_100._0_8_ =
         (local_80->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
         array + (long)pMVar10;
    local_e8 = local_80;
    local_d0.m_value = 3;
    local_100._16_8_ = pdVar12;
    local_d8 = (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)pMVar10;
    SVar6 = DenseBase<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,-1,false>>::maxCoeff<0,long>
                      ((DenseBase<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,_1,false>> *)
                       local_100,(long *)&local_108);
    uVar1 = (long)(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array + local_108;
    if ((this->m_nonzero_pivots == 3) && (SVar6 * SVar6 < (double)(int)pdVar12 * local_98)) {
      this->m_nonzero_pivots = (Index)pMVar10;
    }
    (this->m_colsTranspositions).super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.
    m_storage.m_data.array[(long)pMVar10] = uVar1;
    if (local_108 != 0) {
      if (2 < uVar1) {
        local_108 = uVar1;
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 3, 3>, BlockRows = 3, BlockCols = 1, InnerPanel = true]"
                     );
      }
      pdVar2 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + uVar1 * 3;
      dVar5 = *pdVar2;
      dVar19 = pdVar2[1];
      pdVar2 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + (long)pMVar10 * 3;
      dVar20 = pdVar2[1];
      pdVar11 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + uVar1 * 3;
      *pdVar11 = *pdVar2;
      pdVar11[1] = dVar20;
      pdVar2 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + (long)pMVar10 * 3;
      *pdVar2 = dVar5;
      pdVar2[1] = dVar19;
      dVar5 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[(long)pMVar10 * 3 + 2];
      (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[(long)pMVar10 * 3 + 2] =
           (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[uVar1 * 3 + 2];
      (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[uVar1 * 3 + 2] = dVar5;
      dVar5 = (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              .m_storage.m_data.array[(long)pMVar10];
      (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[(long)pMVar10] =
           (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[uVar1];
      (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[uVar1] = dVar5;
      dVar5 = (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[(long)pMVar10];
      (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[(long)pMVar10] =
           (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[uVar1];
      (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[uVar1] = dVar5;
      local_128 = local_128 + 1;
    }
    pdVar11 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + (long)pMVar10 * 3;
    local_d0.m_value = 0;
    local_c0 = 3;
    local_a8 = 3;
    pdVar2 = (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + (long)pMVar10;
    local_108 = uVar1;
    local_100._0_8_ = pdVar11 + (long)pMVar10;
    local_100._8_8_ = pdVar12;
    local_e8 = (RealRowVectorType *)pdVar11;
    local_d8 = this;
    local_c8.m_value = (long)pMVar10;
    local_b8.m_value = (long)pMVar10;
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
    ::makeHouseholderInPlace
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                *)local_100,pdVar2,&local_70);
    pdVar11[(long)pMVar10] = local_70;
    dVar5 = ABS(local_70);
    if (this->m_maxpivot <= dVar5 && dVar5 != this->m_maxpivot) {
      this->m_maxpivot = dVar5;
    }
    local_100._8_8_ = 2 - (long)pMVar10;
    pMVar3 = (XprTypeNested)
             ((long)(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array + 1);
    local_68.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
    .m_d._0_8_ = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array +
                 (long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage +
                 (long)&pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * 3 +
                 3;
    local_38 = 3;
    local_100._0_8_ =
         pdVar11 + (long)((long)(pMVar10->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array + 1);
    local_d0.m_value = 0;
    local_c0 = 3;
    local_a8 = 3;
    local_e8 = (RealRowVectorType *)pdVar11;
    local_d8 = this;
    local_c8.m_value = (long)pMVar10;
    local_b8.m_value = (long)pMVar3;
    local_78 = local_100._8_8_;
    local_68.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
    .
    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
    .m_data = pdVar12;
    local_68.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
    .
    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
    ._8_8_ = local_100._8_8_;
    local_50 = this;
    local_48 = pMVar10;
    local_40 = pMVar3;
    MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>>::
    applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1>>
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>> *)&local_68,
               (VectorBlock<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1> *)
               local_100,pdVar2,
               (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
               m_data.array +
               (long)((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                             .m_storage.m_data + 1));
    lVar9 = local_110;
    lVar13 = local_118;
    lVar14 = local_120;
    if (pMVar10 < (XprTypeNested)0x2) {
      do {
        dVar5 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[lVar9];
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          dVar19 = ABS(*(double *)
                        ((long)(this->m_qr).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + lVar14 + 0x18)) / dVar5;
          dVar20 = (dVar19 + 1.0) * (1.0 - dVar19);
          dVar19 = 0.0;
          if (0.0 <= dVar20) {
            dVar19 = dVar20;
          }
          dVar20 = dVar5 / (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                           .m_storage.m_data.array[lVar9 + 3];
          if (dVar20 * dVar20 * dVar19 <= 1.4901161193847656e-08) {
            local_c8.m_value = lVar9 - 0x14;
            local_e8 = (RealRowVectorType *)
                       ((long)(this->m_qr).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar13);
            local_100._0_8_ =
                 (long)(this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar14 + 0x20;
            local_100._8_8_ = local_78;
            local_d0.m_value = 0;
            local_c0 = 3;
            local_a8 = 3;
            local_d8 = this;
            local_b8.m_value = (long)pMVar3;
            local_68.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
            .m_d.argImpl.
            super_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
            .
            super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
            .m_data = (PointerType)local_100._0_8_;
            SVar7 = internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const>>
                              (&local_68,&local_129,
                               (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                                *)local_100);
            dVar5 = SQRT(SVar7);
            (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[lVar9 + 3] = dVar5;
          }
          else {
            dVar5 = dVar5 * SQRT(dVar19);
          }
          (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[lVar9] = dVar5;
        }
        lVar9 = lVar9 + 1;
        lVar14 = lVar14 + 0x18;
        lVar13 = lVar13 + 0x18;
      } while (lVar9 != 0x17);
    }
    local_110 = local_110 + 1;
    local_120 = local_120 + 0x20;
    local_118 = local_118 + 0x18;
    pMVar10 = pMVar3;
  } while (pMVar3 != (XprTypeNested)0x3);
  pPVar8 = &(this->m_colsPermutation).m_indices.
            super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>;
  (pPVar8->m_storage).m_data.array[0] = 0;
  (pPVar8->m_storage).m_data.array[1] = 1;
  (this->m_colsPermutation).m_indices.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] = 2;
  lVar9 = 0;
  do {
    PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_>::applyTranspositionOnTheRight
              ((PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_> *)&this->m_colsPermutation,
               lVar9,(long)(int)(this->m_colsTranspositions).
                                super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.m_storage
                                .m_data.array[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  this->m_det_pq = -(ulong)((uint)local_128 & 1) | 1;
  this->m_isInitialized = true;
  return;
}

Assistant:

void ColPivHouseholderQR<MatrixType>::computeInPlace()
{
  check_template_parameters();

  // the column permutation is stored as int indices, so just to be sure:
  eigen_assert(m_qr.cols()<=NumTraits<int>::highest());

  using std::abs;

  Index rows = m_qr.rows();
  Index cols = m_qr.cols();
  Index size = m_qr.diagonalSize();

  m_hCoeffs.resize(size);

  m_temp.resize(cols);

  m_colsTranspositions.resize(m_qr.cols());
  Index number_of_transpositions = 0;

  m_colNormsUpdated.resize(cols);
  m_colNormsDirect.resize(cols);
  for (Index k = 0; k < cols; ++k) {
    // colNormsDirect(k) caches the most recent directly computed norm of
    // column k.
    m_colNormsDirect.coeffRef(k) = m_qr.col(k).norm();
    m_colNormsUpdated.coeffRef(k) = m_colNormsDirect.coeffRef(k);
  }

  RealScalar threshold_helper =  numext::abs2<RealScalar>(m_colNormsUpdated.maxCoeff() * NumTraits<RealScalar>::epsilon()) / RealScalar(rows);
  RealScalar norm_downdate_threshold = numext::sqrt(NumTraits<RealScalar>::epsilon());

  m_nonzero_pivots = size; // the generic case is that in which all pivots are nonzero (invertible case)
  m_maxpivot = RealScalar(0);

  for(Index k = 0; k < size; ++k)
  {
    // first, we look up in our table m_colNormsUpdated which column has the biggest norm
    Index biggest_col_index;
    RealScalar biggest_col_sq_norm = numext::abs2(m_colNormsUpdated.tail(cols-k).maxCoeff(&biggest_col_index));
    biggest_col_index += k;

    // Track the number of meaningful pivots but do not stop the decomposition to make
    // sure that the initial matrix is properly reproduced. See bug 941.
    if(m_nonzero_pivots==size && biggest_col_sq_norm < threshold_helper * RealScalar(rows-k))
      m_nonzero_pivots = k;

    // apply the transposition to the columns
    m_colsTranspositions.coeffRef(k) = biggest_col_index;
    if(k != biggest_col_index) {
      m_qr.col(k).swap(m_qr.col(biggest_col_index));
      std::swap(m_colNormsUpdated.coeffRef(k), m_colNormsUpdated.coeffRef(biggest_col_index));
      std::swap(m_colNormsDirect.coeffRef(k), m_colNormsDirect.coeffRef(biggest_col_index));
      ++number_of_transpositions;
    }

    // generate the householder vector, store it below the diagonal
    RealScalar beta;
    m_qr.col(k).tail(rows-k).makeHouseholderInPlace(m_hCoeffs.coeffRef(k), beta);

    // apply the householder transformation to the diagonal coefficient
    m_qr.coeffRef(k,k) = beta;

    // remember the maximum absolute value of diagonal coefficients
    if(abs(beta) > m_maxpivot) m_maxpivot = abs(beta);

    // apply the householder transformation
    m_qr.bottomRightCorner(rows-k, cols-k-1)
        .applyHouseholderOnTheLeft(m_qr.col(k).tail(rows-k-1), m_hCoeffs.coeffRef(k), &m_temp.coeffRef(k+1));

    // update our table of norms of the columns
    for (Index j = k + 1; j < cols; ++j) {
      // The following implements the stable norm downgrade step discussed in
      // http://www.netlib.org/lapack/lawnspdf/lawn176.pdf
      // and used in LAPACK routines xGEQPF and xGEQP3.
      // See lines 278-297 in http://www.netlib.org/lapack/explore-html/dc/df4/sgeqpf_8f_source.html
      if (m_colNormsUpdated.coeffRef(j) != RealScalar(0)) {
        RealScalar temp = abs(m_qr.coeffRef(k, j)) / m_colNormsUpdated.coeffRef(j);
        temp = (RealScalar(1) + temp) * (RealScalar(1) - temp);
        temp = temp <  RealScalar(0) ? RealScalar(0) : temp;
        RealScalar temp2 = temp * numext::abs2<RealScalar>(m_colNormsUpdated.coeffRef(j) /
                                                           m_colNormsDirect.coeffRef(j));
        if (temp2 <= norm_downdate_threshold) {
          // The updated norm has become too inaccurate so re-compute the column
          // norm directly.
          m_colNormsDirect.coeffRef(j) = m_qr.col(j).tail(rows - k - 1).norm();
          m_colNormsUpdated.coeffRef(j) = m_colNormsDirect.coeffRef(j);
        } else {
          m_colNormsUpdated.coeffRef(j) *= numext::sqrt(temp);
        }
      }
    }
  }

  m_colsPermutation.setIdentity(PermIndexType(cols));
  for(PermIndexType k = 0; k < size/*m_nonzero_pivots*/; ++k)
    m_colsPermutation.applyTranspositionOnTheRight(k, PermIndexType(m_colsTranspositions.coeff(k)));

  m_det_pq = (number_of_transpositions%2) ? -1 : 1;
  m_isInitialized = true;
}